

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

uchar * stbir_resize_uint8_linear
                  (uchar *input_pixels,int input_w,int input_h,int input_stride_in_bytes,
                  uchar *output_pixels,int output_w,int output_h,int output_stride_in_bytes,
                  stbir_pixel_layout pixel_layout)

{
  int iVar1;
  int opitch;
  uchar *optr;
  STBIR_RESIZE resize;
  
  iVar1 = stbir__check_output_stuff
                    (&optr,&opitch,output_pixels,1,output_w,output_h,output_stride_in_bytes,
                     stbir__pixel_layout_convert_public_to_internal[pixel_layout]);
  if (iVar1 != 0) {
    if (optr != (uchar *)0x0) {
      output_pixels = optr;
    }
    resize.user_data = &resize;
    resize.output_h = output_h;
    resize.output_stride_in_bytes = opitch;
    resize.fast_alpha = 0;
    resize.input_cb = (stbir_input_callback *)0x0;
    resize.output_cb = (stbir_output_callback *)0x0;
    resize.called_alloc = 0;
    resize.input_s0 = 0.0;
    resize.input_t0 = 0.0;
    resize.horizontal_filter = STBIR_FILTER_DEFAULT;
    resize.vertical_filter = STBIR_FILTER_DEFAULT;
    resize.horizontal_edge = STBIR_EDGE_CLAMP;
    resize.vertical_edge = STBIR_EDGE_CLAMP;
    resize.horizontal_filter_kernel = (stbir__kernel_callback *)0x0;
    resize.horizontal_filter_support = (stbir__support_callback *)0x0;
    resize.vertical_filter_kernel = (stbir__kernel_callback *)0x0;
    resize.vertical_filter_support = (stbir__support_callback *)0x0;
    resize.samplers = (stbir__info *)0x0;
    resize.input_s1 = 1.0;
    resize.input_t1 = 1.0;
    resize.output_subx = 0;
    resize.output_suby = 0;
    resize.output_subh = output_h;
    resize.input_data_type = STBIR_TYPE_UINT8;
    resize.output_data_type = STBIR_TYPE_UINT8;
    resize.input_pixel_layout_public = pixel_layout;
    resize.output_pixel_layout_public = pixel_layout;
    resize.needs_rebuild = 1;
    resize.input_pixels = input_pixels;
    resize.input_w = input_w;
    resize.input_h = input_h;
    resize.output_pixels = output_pixels;
    resize.output_w = output_w;
    resize.output_subw = output_w;
    resize.input_stride_in_bytes = input_stride_in_bytes;
    iVar1 = stbir_resize_extended((STBIR_RESIZE *)resize.user_data);
    if (iVar1 == 0) {
      output_pixels = (uchar *)0x0;
    }
    if (iVar1 != 0 || optr == (uchar *)0x0) {
      return output_pixels;
    }
    free(optr);
  }
  return (uchar *)0x0;
}

Assistant:

STBIRDEF unsigned char * stbir_resize_uint8_linear( const unsigned char *input_pixels , int input_w , int input_h, int input_stride_in_bytes,
                                                          unsigned char *output_pixels, int output_w, int output_h, int output_stride_in_bytes,
                                                          stbir_pixel_layout pixel_layout )
{
  STBIR_RESIZE resize;
  unsigned char * optr;
  int opitch;

  if ( !stbir__check_output_stuff( (void**)&optr, &opitch, output_pixels, sizeof( unsigned char ), output_w, output_h, output_stride_in_bytes, stbir__pixel_layout_convert_public_to_internal[ pixel_layout ] ) )
    return 0;

  stbir_resize_init( &resize,
                     input_pixels,  input_w,  input_h,  input_stride_in_bytes,
                     (optr) ? optr : output_pixels, output_w, output_h, opitch,
                     pixel_layout, STBIR_TYPE_UINT8 );

  if ( !stbir_resize_extended( &resize ) )
  {
    if ( optr )
      STBIR_FREE( optr, 0 );
    return 0;
  }

  return (optr) ? optr : output_pixels;
}